

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_subs(DisasContext_conflict14 *ctx,TCGv_i32 ret,TCGv_i32 r1,TCGv_i32 r2)

{
  TCGContext_conflict9 *tcg_ctx_00;
  TCGContext_conflict9 *tcg_ctx;
  TCGv_i32 r2_local;
  TCGv_i32 r1_local;
  TCGv_i32 ret_local;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  gen_helper_sub_ssov(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,r1,r2);
  return;
}

Assistant:

static inline void gen_subs(DisasContext *ctx, TCGv ret, TCGv r1, TCGv r2)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    gen_helper_sub_ssov(tcg_ctx, ret, tcg_ctx->cpu_env, r1, r2);
}